

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileMutator.cpp
# Opt level: O3

DynamicProfileMutator * DynamicProfileMutator::GetMutator(void)

{
  LPCWSTR pWVar1;
  bool bVar2;
  HMODULE hModule;
  FARPROC p_Var3;
  DynamicProfileMutator *pDVar4;
  char16_t *form;
  
  bVar2 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileMutatorFlag);
  pWVar1 = DAT_015991d0;
  if (!bVar2) {
    return (DynamicProfileMutator *)0x0;
  }
  hModule = LoadLibraryW(DAT_015991d0);
  if (hModule == (HMODULE)0x0) {
    form = L"ERROR: Unable to load dynamic profile mutator dll %s\n";
  }
  else {
    p_Var3 = GetProcAddress(hModule,"CreateDynamicProfileMutator");
    if (p_Var3 == (FARPROC)0x0) {
      Output::Print(L"ERROR: Unable to get function %S from dll %s\n","CreateDynamicProfileMutator",
                    pWVar1);
      goto LAB_0096a731;
    }
    pDVar4 = (DynamicProfileMutator *)(*p_Var3)();
    if (pDVar4 != (DynamicProfileMutator *)0x0) {
      (**(code **)(*(long *)pDVar4 + 0x10))(pDVar4,DAT_015991d8);
      return pDVar4;
    }
    form = L"ERROR: Failed to create mutator from dll %s\n";
  }
  Output::Print(form,pWVar1);
LAB_0096a731:
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

DynamicProfileMutator *
DynamicProfileMutator::GetMutator()
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileMutatorFlag))
    {
        return nullptr;
    }

    char16 const * dllname = Js::Configuration::Global.flags.DynamicProfileMutatorDll;
    HMODULE hModule = ::LoadLibraryW(dllname);
    if (hModule == nullptr)
    {
        Output::Print(_u("ERROR: Unable to load dynamic profile mutator dll %s\n"), dllname);
        Js::Throw::FatalInternalError();
    }

    CreateMutatorFunc procAddress = (CreateMutatorFunc)::GetProcAddress(hModule, CreateMutatorProcName);

    if (procAddress == nullptr)
    {
        Output::Print(_u("ERROR: Unable to get function %S from dll %s\n"), CreateMutatorProcName, dllname);
        Js::Throw::FatalInternalError();
    }

    DynamicProfileMutator * mutator = procAddress();
    if (mutator == nullptr)
    {
        Output::Print(_u("ERROR: Failed to create mutator from dll %s\n"), dllname);
        Js::Throw::FatalInternalError();
    }
    mutator->Initialize(Js::Configuration::Global.flags.DynamicProfileMutator);
    return mutator;
}